

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment-map.c
# Opt level: O2

mi_segmap_part_t *
mi_segment_map_index_of(mi_segment_t *segment,_Bool create_on_demand,size_t *idx,size_t *bitidx)

{
  mi_memid_t memid_00;
  mi_segmap_part_t *p;
  mi_segmap_part_t *pmVar1;
  bool bVar2;
  mi_memid_t memid;
  anon_union_16_2_8cef793c_for_mem local_40;
  undefined8 local_30;
  
  *idx = 0;
  *bitidx = 0;
  if ((uint)((ulong)segment >> 0x2c) < 3) {
    p = mi_segment_map[(ulong)segment / 0x1f800000000];
    if (mi_segment_map[(ulong)segment / 0x1f800000000] == (mi_segmap_part_t *)0x0) {
      if ((!create_on_demand) ||
         (p = (mi_segmap_part_t *)_mi_os_alloc(0x1f98,(mi_memid_t *)&local_40.os),
         p == (mi_segmap_part_t *)0x0)) {
        return (mi_segmap_part_t *)0x0;
      }
      (p->memid).is_pinned = (_Bool)(undefined1)local_30;
      (p->memid).initially_committed = (_Bool)local_30._1_1_;
      (p->memid).initially_zero = (_Bool)local_30._2_1_;
      (p->memid).field_0x13 = local_30._3_1_;
      (p->memid).memkind = local_30._4_4_;
      (p->memid).mem.os.base = local_40.os.base;
      (p->memid).mem.os.size = local_40.os.size;
      LOCK();
      pmVar1 = mi_segment_map[(ulong)segment / 0x1f800000000];
      bVar2 = pmVar1 == (mi_segmap_part_t *)0x0;
      if (bVar2) {
        mi_segment_map[(ulong)segment / 0x1f800000000] = p;
        pmVar1 = (mi_segmap_part_t *)0x0;
      }
      UNLOCK();
      if (!bVar2) {
        memid_00.mem.os.size = local_40.os.size;
        memid_00.mem.os.base = local_40.os.base;
        memid_00.is_pinned = (_Bool)(undefined1)local_30;
        memid_00.initially_committed = (_Bool)local_30._1_1_;
        memid_00.initially_zero = (_Bool)local_30._2_1_;
        memid_00._19_1_ = local_30._3_1_;
        memid_00.memkind = local_30._4_4_;
        _mi_os_free(p,0x1f98,memid_00);
        p = pmVar1;
      }
    }
    *idx = (ulong)segment % 0x1f800000000 >> 0x1f;
    *bitidx = (ulong)((uint)((ulong)segment % 0x1f800000000 >> 0x19) & 0x3f);
  }
  else {
    p = (mi_segmap_part_t *)0x0;
  }
  return p;
}

Assistant:

static mi_segmap_part_t* mi_segment_map_index_of(const mi_segment_t* segment, bool create_on_demand, size_t* idx, size_t* bitidx) {
  // note: segment can be invalid or NULL.
  mi_assert_internal(_mi_ptr_segment(segment + 1) == segment); // is it aligned on MI_SEGMENT_SIZE?
  *idx = 0;
  *bitidx = 0;  
  if ((uintptr_t)segment >= MI_SEGMENT_MAP_MAX_ADDRESS) return NULL;
  const uintptr_t segindex = ((uintptr_t)segment) / MI_SEGMENT_MAP_PART_SPAN;
  if (segindex >= MI_SEGMENT_MAP_MAX_PARTS) return NULL;
  mi_segmap_part_t* part = mi_atomic_load_ptr_relaxed(mi_segmap_part_t, &mi_segment_map[segindex]);

  // allocate on demand to reduce .bss footprint
  if mi_unlikely(part == NULL) {
    if (!create_on_demand) return NULL;
    mi_memid_t memid;
    part = (mi_segmap_part_t*)_mi_os_alloc(sizeof(mi_segmap_part_t), &memid);
    if (part == NULL) return NULL;
    part->memid = memid;
    mi_segmap_part_t* expected = NULL;
    if (!mi_atomic_cas_ptr_strong_release(mi_segmap_part_t, &mi_segment_map[segindex], &expected, part)) {
      _mi_os_free(part, sizeof(mi_segmap_part_t), memid);
      part = expected;
      if (part == NULL) return NULL;
    }
  }